

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArrayBase::SetPropertyWithAttributes
          (TypedArrayBase *this,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  bool bVar1;
  uint32 uVar2;
  BOOL BVar3;
  ScriptContext *this_00;
  PropertyRecord *this_01;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext;
  PropertyOperationFlags flags_local;
  PropertyValueInfo *info_local;
  PropertyAttributes attributes_local;
  Var value_local;
  PropertyId propertyId_local;
  TypedArrayBase *this_local;
  
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_01 = ScriptContext::GetPropertyName(this_00,propertyId);
  bVar1 = PropertyRecord::IsNumeric(this_01);
  if (bVar1) {
    ArrayObject::VerifySetItemAttributes((ArrayObject *)this,propertyId,attributes);
    uVar2 = PropertyRecord::GetNumericValue(this_01);
    this_local._4_4_ =
         (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
           _vptr_IRecyclerVisitedObject[0x29])(this,(ulong)uVar2,value,0);
  }
  else {
    bVar1 = PropertyRecord::IsSymbol(this_01);
    if ((!bVar1) && (BVar3 = CanonicalNumericIndexString(propertyId,this_00), BVar3 != 0)) {
      return 0;
    }
    this_local._4_4_ =
         DynamicObject::SetPropertyWithAttributes
                   ((DynamicObject *)this,propertyId,value,attributes,info,flags,possibleSideEffects
                   );
  }
  return this_local._4_4_;
}

Assistant:

BOOL TypedArrayBase::SetPropertyWithAttributes(PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = GetScriptContext();

        const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyRecord->IsNumeric())
        {
            VerifySetItemAttributes(propertyId, attributes);
            return SetItem(propertyRecord->GetNumericValue(), value);
        }

        if (!propertyRecord->IsSymbol() && CanonicalNumericIndexString(propertyId, scriptContext))
        {
            return FALSE;
        }

        return __super::SetPropertyWithAttributes(propertyId, value, attributes, info, flags, possibleSideEffects);
    }